

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# report.c
# Opt level: O3

void pcut_report_test_done_unparsed
               (pcut_item_t *test,int outcome,char *unparsed_output,size_t unparsed_output_size)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  char *__dest;
  char *__dest_00;
  ulong __n;
  bool bVar4;
  ulong local_48;
  ulong local_40;
  
  __dest = buffer_for_extra_output;
  local_40 = 0x1000;
  memset(buffer_for_extra_output,0,0x1000);
  __dest_00 = buffer_for_error_messages;
  memset(buffer_for_error_messages,0,0x1000);
  if (unparsed_output[unparsed_output_size - 1] == '\0') {
    local_48 = 0x1000;
    do {
      lVar3 = 1 - unparsed_output_size;
      uVar2 = 0;
      while (*unparsed_output == '\0') {
        uVar2 = uVar2 + 1;
        unparsed_output = unparsed_output + 1;
        lVar3 = lVar3 + 1;
        if (lVar3 == 1) goto LAB_00101bed;
      }
      iVar1 = pcut_str_size(unparsed_output);
      __n = (ulong)iVar1;
      if (uVar2 < 2) {
        bVar4 = local_40 < __n;
        local_40 = local_40 - __n;
        if (bVar4) break;
        memcpy(__dest,unparsed_output,__n);
        __dest = __dest + __n;
      }
      else {
        bVar4 = local_48 < __n;
        local_48 = local_48 - __n;
        if (bVar4) break;
        memcpy(__dest_00,unparsed_output,__n);
        __dest_00 = __dest_00 + __n;
      }
      unparsed_output = unparsed_output + __n + 1;
      unparsed_output_size = -(lVar3 + __n);
    } while( true );
  }
LAB_00101bed:
  if ((report_ops != (pcut_report_ops_t *)0x0) &&
     (report_ops->test_done != (_func_void_pcut_item_t_ptr_int_char_ptr_char_ptr_char_ptr *)0x0)) {
    (*report_ops->test_done)
              (test,outcome,buffer_for_error_messages,(char *)0x0,buffer_for_extra_output);
    return;
  }
  return;
}

Assistant:

void pcut_report_test_done_unparsed(pcut_item_t *test, int outcome,
		const char *unparsed_output, size_t unparsed_output_size) {

	parse_command_output(unparsed_output, unparsed_output_size,
			buffer_for_extra_output, BUFFER_SIZE,
			buffer_for_error_messages, BUFFER_SIZE);

	pcut_report_test_done(test, outcome, buffer_for_error_messages, NULL, buffer_for_extra_output);
}